

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

void goto_level(d_level *newlevel,boolean at_stairs,boolean falling,boolean portal)

{
  undefined1 *puVar1;
  char cVar2;
  char cVar3;
  xchar lx;
  xchar ly;
  xchar hx;
  xchar hy;
  level *plVar4;
  coord *__s;
  xchar xVar5;
  level *plVar6;
  schar sVar7;
  schar sVar8;
  boolean bVar9;
  xchar xVar10;
  xchar xVar11;
  boolean bVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  s_level *psVar16;
  monst *pmVar17;
  obj *poVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  d_level *src;
  char *pcVar22;
  char *line;
  char cVar23;
  char x;
  trap *trap;
  obj *obj;
  monst *pmVar24;
  char **ppcVar25;
  coord *__s_00;
  int tmp;
  uint uVar26;
  xchar nhx;
  xchar nhy;
  xchar rtype;
  coord cc;
  
  sVar7 = depth(newlevel);
  sVar8 = depth(&u.uz);
  xVar5 = u.uz.dnum;
  cVar2 = newlevel->dnum;
  bVar9 = In_W_tower(level,(int)u.ux,(int)u.uy);
  xVar10 = dunlev(newlevel);
  xVar11 = dunlevs_in_dungeon(newlevel);
  if (xVar11 < xVar10) {
    xVar10 = dunlevs_in_dungeon(newlevel);
    newlevel->dlevel = xVar10;
  }
  if ((xVar5 != cVar2) && (newlevel->dnum == dungeon_topology.d_astral_level.dnum)) {
    if ((u.uhave._0_1_ & 1) == 0) {
      return;
    }
    psVar16 = get_first_elemental_plane();
    pline("Well done, mortal!");
    pline("But now thou must face the final Test...");
    pline("Prove thyself worthy or perish!");
    src = &psVar16->dlevel;
    if (psVar16 == (s_level *)0x0) {
      src = (d_level *)0x0;
    }
    assign_level(newlevel,src);
  }
  xVar10 = ledger_no(newlevel);
  if (xVar10 < '\x01') {
    done(0xf);
  }
  bVar12 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if ((bVar12 != '\0' && xVar5 == cVar2) && (bVar12 = ok_to_quest(), bVar12 == '\0')) {
    pline("A mysterious force prevents you from descending.");
    return;
  }
  bVar12 = on_level(newlevel,&u.uz);
  if (bVar12 != '\0') {
    return;
  }
  if (falling != '\0') {
    impact_drop((obj *)0x0,u.ux,u.uy,newlevel->dlevel);
  }
  check_special_room('\x01');
  if (uball != (obj *)0x0) {
    unplacebc();
  }
  u.utrap = 0;
  fill_pit(level,(int)u.ux,(int)u.uy);
  u.ustuck = (monst *)0x0;
  u._1052_1_ = u._1052_1_ & 0x79;
  bVar12 = on_level(newlevel,&dungeon_topology.d_blackmarket_level);
  if (bVar12 == '\0') {
    bVar12 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
    if (bVar12 != '\0') {
      pcVar22 = "can\'t follow you through the portal.";
      goto LAB_0016fcc3;
    }
    iVar14 = 0;
    pcVar22 = (char *)0x0;
  }
  else {
    pcVar22 = "can\'t follow you into the Black Market.";
LAB_0016fcc3:
    iVar14 = 2;
  }
  keepdogs(iVar14,pcVar22);
  if ((u._1052_1_ & 1) != 0) {
    u._1052_1_ = u._1052_1_ & 0xfe;
    u.uswldtim = 0;
  }
  vision_recalc(2);
  if ((level->flags).purge_monsters != 0) {
    dmonsfree(level);
  }
  update_mlstmv();
  assign_level(&u.uz0,&u.uz);
  assign_level(&u.uz,newlevel);
  assign_level(&u.utolev,newlevel);
  u.utotype = '\0';
  cVar23 = dungeons[u.uz.dnum].entry_lev;
  cVar3 = dungeons[u.uz.dnum].dunlev_ureached;
  xVar11 = dunlev(&u.uz);
  if (cVar23 == '\x01') {
    if (cVar3 < xVar11) {
LAB_0016fd8f:
      xVar11 = dunlev(&u.uz);
      dungeons[u.uz.dnum].dunlev_ureached = xVar11;
    }
  }
  else if ((xVar11 < cVar3) || (dungeons[u.uz.dnum].dunlev_ureached == '\0')) goto LAB_0016fd8f;
  reset_rndmonst(-1);
  plVar6 = level;
  level = (level *)0x0;
  plVar4 = levels[xVar10];
  if (plVar4 == (level *)0x0) {
    pcVar22 = hist_lev_name(&u.uz,'\0');
    historic_event('\0',"reached %s.",pcVar22);
    level = mklev(&u.uz);
  }
  else {
    level = plVar4;
    pmVar17 = plVar4->monlist;
    while (pmVar17 != (monst *)0x0) {
      pmVar24 = pmVar17->nmon;
      uVar21 = moves - level->lastmoves;
      if ((uint)level->lastmoves <= moves && uVar21 != 0) {
        mon_catchup_elapsed_time(pmVar17,(ulong)uVar21);
      }
      restore_cham(pmVar17);
      pmVar17 = pmVar24;
    }
    catchup_dgn_growths(level,(moves - level->lastmoves) / 5);
  }
  transfer_timers(plVar6,level,0);
  transfer_lights(plVar6,level,0);
  vision_reset();
  vision_full_recalc = '\0';
  flush_screen_disable();
  if ((portal == '\0') || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) {
    if ((at_stairs == '\0') || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) {
      if ((bVar9 == '\0') || (bVar9 = On_W_tower_level(&u.uz), bVar9 == '\0')) {
        if (sVar7 < sVar8) {
          lx = (level->updest).lx;
          ly = (level->updest).ly;
          hx = (level->updest).hx;
          hy = (level->updest).hy;
          xVar10 = (level->updest).nlx;
          xVar11 = (level->updest).nly;
          nhx = (level->updest).nhx;
          nhy = (level->updest).nhy;
          rtype = '\x05';
        }
        else {
          lx = (level->dndest).lx;
          ly = (level->dndest).ly;
          hx = (level->dndest).hx;
          hy = (level->dndest).hy;
          xVar10 = (level->dndest).nlx;
          xVar11 = (level->dndest).nly;
          nhx = (level->dndest).nhx;
          nhy = (level->dndest).nhy;
          rtype = '\x06';
        }
      }
      else {
        lx = (level->dndest).nlx;
        ly = (level->dndest).nly;
        hx = (level->dndest).nhx;
        hy = (level->dndest).nhy;
        xVar11 = '\0';
        xVar10 = '\0';
        rtype = '\x06';
        nhy = '\0';
        nhx = '\0';
      }
      place_lregion(level,lx,ly,hx,hy,xVar10,xVar11,nhx,nhy,rtype,(d_level *)0x0);
      if (falling != '\0') {
        if (uball != (obj *)0x0) {
          ballfall();
        }
LAB_0017007b:
        selftouch("Falling, you");
      }
    }
    else if (sVar7 < sVar8) {
      if (at_ladder == '\0') {
        if (xVar5 == cVar2) {
          u_on_dnstairs();
        }
        else {
          bVar9 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
          plVar6 = level;
          if (bVar9 == '\0') {
            u_on_sstairs();
          }
          else {
            uVar21 = 0;
LAB_001700dd:
            do {
              cVar23 = (plVar6->updest).hx;
              cVar3 = (plVar6->updest).lx;
              uVar26 = mt_random();
              x = SUB161(ZEXT416(uVar26) % SEXT816(((long)cVar23 - (long)cVar3) + 1),0) +
                  (plVar6->updest).lx;
              cVar23 = (plVar6->updest).hy;
              cVar3 = (plVar6->updest).ly;
              uVar26 = mt_random();
              cVar23 = SUB161(ZEXT416(uVar26) % SEXT816(((long)cVar23 - (long)cVar3) + 1),0) +
                       (plVar6->updest).ly;
              if ((x < (plVar6->updest).nlx) || ((plVar6->updest).nhx < x)) {
                if ((cVar23 < (plVar6->updest).nly) || ((plVar6->updest).nhy < cVar23))
                goto LAB_001700dd;
              }
              bVar9 = occupied(level,x,cVar23);
              if ((bVar9 == '\0') && ('\f' < level->locations[x][cVar23].typ)) {
                if (uVar21 < 1000) goto LAB_001701da;
                break;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != 0x3e9);
            warning("Castle: placement failed to find good pos");
LAB_001701da:
            u_on_newpos((int)x,(int)cVar23);
          }
        }
      }
      else {
        u_on_newpos((int)(level->dnladder).sx,(int)(level->dnladder).sy);
      }
      if ((((uball != (obj *)0x0) && (u.uprops[0x12].intrinsic == 0)) &&
          (u.uprops[0x12].extrinsic == 0)) && ((youmonst.data)->mlet != '\x05')) {
        pcVar22 = "ladder";
        if (at_ladder == '\0') {
          pcVar22 = "stairs";
        }
        line = "With great effort you climb the %s.";
        goto LAB_0017039b;
      }
    }
    else {
      if (at_ladder == '\0') {
        if (xVar5 == cVar2) {
          u_on_upstairs();
        }
        else {
          u_on_sstairs();
        }
      }
      else {
        u_on_newpos((int)(level->upladder).sx,(int)(level->upladder).sy);
      }
      if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
         ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
        iVar14 = near_capacity();
        if ((0 < iVar14) ||
           (((uball != (obj *)0x0 &&
             (((uwep != uball || (u.weapon_skills[0xe].skill < '\x02')) || (urole.malenum != 0x15d))
             )) || ((u.uprops[0x25].intrinsic != 0 || (u.uprops[0x25].extrinsic != 0)))))) {
          pcVar22 = "ladder";
          if (at_ladder == '\0') {
            pcVar22 = "stairs";
          }
          pline("You fall down the %s.",pcVar22);
          if ((uball != (obj *)0x0) && (drag_down(), uball->where == '\x03')) {
            if (uwep == uball) {
              setuwep((obj *)0x0);
            }
            if (uswapwep == uball) {
              setuswapwep((obj *)0x0);
            }
            if (uquiver == uball) {
              setuqwep((obj *)0x0);
            }
            freeinv(uball);
          }
          if (u.usteed == (monst *)0x0) {
            uVar21 = mt_random();
            losehp(uVar21 % 3 + 1,"falling downstairs",1);
          }
          else {
            dismount_steed(1);
          }
          goto LAB_0017007b;
        }
      }
      else {
        pcVar22 = "ladder";
        if (at_ladder == '\0') {
          pcVar22 = "stairs";
        }
        line = "You fly down along the %s.";
LAB_0017039b:
        pline(line,pcVar22);
      }
    }
  }
  else {
    trap = (trap *)&level->lev_traps;
    do {
      trap = trap->ntrap;
      if (trap == (trap *)0x0) {
        panic("goto_level: no corresponding portal!");
      }
    } while ((trap->field_0x8 & 0x1f) != 0x12);
    seetrap(trap);
    u_on_newpos((int)trap->tx,(int)trap->ty);
  }
  if (uball != (obj *)0x0) {
    placebc();
  }
  while (poVar18 = level->objects[0][0], obj = invent, poVar18 != (obj *)0x0) {
    deliver_object(poVar18,u.uz.dnum,u.uz.dlevel,9);
  }
  for (; obj != (obj *)0x0; obj = obj->nobj) {
    set_obj_level(level,obj);
  }
  losedogs();
  kill_genocided_monsters();
  run_timers();
  initrack();
  lVar19 = (long)u.ux;
  lVar20 = (long)u.uy;
  pmVar17 = level->monsters[lVar19][lVar20];
  if (pmVar17 != (monst *)0x0) {
    pmVar24 = (monst *)0x0;
    if ((pmVar17->field_0x61 & 2) == 0) {
      pmVar24 = pmVar17;
    }
    if ((pmVar24 != (monst *)0x0) && (pmVar24 != u.usteed)) {
      uVar21 = mt_random();
      if (((uVar21 & 1) == 0) &&
         ((bVar9 = enexto(&cc,level,u.ux,u.uy,youmonst.data), bVar9 != '\0' &&
          (iVar14 = dist2((int)cc.x,(int)cc.y,(int)u.ux,(int)u.uy), iVar14 < 3)))) {
        u_on_newpos((int)cc.x,(int)cc.y);
      }
      else {
        mnexto(pmVar24);
      }
      lVar19 = (long)u.ux;
      lVar20 = (long)u.uy;
      pmVar17 = level->monsters[lVar19][lVar20];
      if ((pmVar17 != (monst *)0x0) && ((pmVar17->field_0x61 & 2) == 0)) {
        impossible("mnexto failed (do.c)?");
        rloc(level,pmVar17,'\0');
        lVar19 = (long)u.ux;
        lVar20 = (long)u.uy;
      }
    }
  }
  puVar1 = &level->locations[lVar19][lVar20].field_0x6;
  *puVar1 = *puVar1 | 4;
  bVar9 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar9 != '\0') {
    movebubbles();
  }
  uVar21 = *(uint *)&(level->flags).field_0x8;
  if ((uVar21 >> 0x16 & 1) != 0) {
    *(uint *)&(level->flags).field_0x8 = uVar21 & 0xffbfffff;
  }
  notify_levelchange((d_level *)0x0);
  vision_reset();
  doredraw();
  flush_screen_enable();
  flush_screen();
  check_special_room('\0');
  bVar9 = In_hell(&u.uz0);
  if ((bVar9 == '\0') && (bVar9 = In_hell(&u.uz), bVar9 != '\0')) {
    bVar9 = on_level(&u.uz,&dungeon_topology.d_valley_level);
    if (bVar9 == '\0') {
      pline("It is hot here.  You smell smoke...");
    }
    else {
      pline("You arrive at the Valley of the Dead...");
      pline("The odor of burnt flesh and decay pervades the air.");
      You_hear("groans and moans everywhere.");
    }
  }
  if ((uVar21 >> 0x16 & 1) != 0) {
    uVar21 = mt_random();
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((ppcVar25 = goto_level::halu_fam_msgs, u.umonnum != u.umonster &&
        (bVar9 = dmgtype(youmonst.data,0x24), bVar9 != '\0')))) {
      ppcVar25 = goto_level::fam_msgs;
    }
    __s = (coord *)ppcVar25[uVar21 & 3];
    if (__s != (coord *)0x0) {
      pcVar22 = strchr((char *)__s,0x25);
      __s_00 = __s;
      if (pcVar22 != (char *)0x0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00170622;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00170619;
          pcVar22 = "looks";
        }
        else {
LAB_00170619:
          if (ublindf == (obj *)0x0) {
            pcVar22 = "seems";
          }
          else {
LAB_00170622:
            pcVar22 = "seems";
            if (ublindf->oartifact == '\x1d') {
              pcVar22 = "looks";
            }
          }
        }
        __s_00 = &cc;
        sprintf(&__s_00->x,(char *)__s,pcVar22);
      }
      pline(&__s_00->x);
    }
  }
  if (plVar4 == (level *)0x0) {
    bVar9 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar9 != '\0') {
      pline("You enter what seems to be an older, more primitive world.");
    }
    if ((((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
        ((u.umonnum == u.umonster || (bVar9 = dmgtype(youmonst.data,0x24), bVar9 == '\0')))) &&
       ((urole.malenum == 0x159 &&
        (bVar9 = on_level(&u.uz,&dungeon_topology.d_juiblex_level), bVar9 != '\0')))) {
      pline("Ahh, Venice.");
    }
  }
  if ((u.uz.dnum == dungeon_topology.d_astral_level.dnum && xVar5 != cVar2) &&
     ((u.uhave._0_1_ & 1) != 0)) {
    resurrect();
  }
  if ((xVar5 != cVar2) &&
     (((bVar9 = In_V_tower(&u.uz), bVar9 != '\0' || (u.uz.dnum == dungeon_topology.d_dragon_dnum))
      && (bVar9 = In_hell(&u.uz0), bVar9 != '\0')))) {
    pline("The heat and smoke are gone.");
  }
  bVar9 = In_quest(&u.uz0);
  if (((bVar9 == '\0') && (bVar9 = at_dgn_entrance(&u.uz,"The Quest"), bVar9 != '\0')) &&
     (((u.uevent._0_2_ & 0x30) == 0 && ((quest_status._2_1_ & 0x10) == 0)))) {
    if (u.uprops[0x19].blocked == 0) {
      if ((u.uevent._0_2_ & 8) == 0) {
        com_pager(2);
        u.uevent._0_2_ = u.uevent._0_2_ | 8;
      }
      else {
        com_pager((urole.malenum == 0x164) + 3);
      }
    }
    else if (uarmh != (obj *)0x0) {
      pcVar22 = yname(uarmh);
      pline("You sense something being blocked by %s.",pcVar22);
    }
  }
  iVar14 = getmonth();
  if (((iVar14 == 0xc) && (iVar14 = getmday(), iVar14 < 0x19)) &&
     (bVar9 = mk_advcal_portal(level), bVar9 != '\0')) {
    pline("You smell chocolate!");
  }
  bVar9 = on_level(&u.uz,&dungeon_topology.d_advcal_level);
  if (bVar9 != '\0') {
    fill_advent_calendar(level,'\0');
  }
  bVar9 = on_level(&u.uz,&dungeon_topology.d_knox_level);
  if ((bVar9 != '\0') && ((plVar4 == (level *)0x0 || (mvitals[0x129].died == '\0')))) {
    pline("You penetrated a high security area!");
    pline("An alarm sounds!");
    for (pmVar17 = level->monlist; pmVar17 != (monst *)0x0; pmVar17 = pmVar17->nmon) {
      if ((0 < pmVar17->mhp) && ((*(uint *)&pmVar17->field_0x60 >> 0x13 & 1) != 0)) {
        *(uint *)&pmVar17->field_0x60 = *(uint *)&pmVar17->field_0x60 & 0xfff7ffff;
      }
    }
  }
  bVar9 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if ((bVar9 != '\0') && (u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0)) {
    set_black_marketeer_angry();
  }
  bVar9 = on_level(&u.uz,&dungeon_topology.d_astral_level);
  if (bVar9 == '\0') {
    onquest();
    goto LAB_00170c79;
  }
  for (pmVar17 = level->monlist; pmVar17 != (monst *)0x0; pmVar17 = pmVar17->nmon) {
    if (0 < pmVar17->mhp) {
      reset_hostility(pmVar17);
    }
  }
  uVar21 = mt_random();
  create_mplayers((uVar21 & 3) + 3,'\x01');
  if (u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) {
    pline("A voice booms: \"Thy desire for conflict shall be fulfilled!\"");
    uVar21 = mt_random();
    iVar14 = (uVar21 & 3) + 2;
    do {
      cc.x = u.ux;
      cc.y = u.uy;
      bVar9 = enexto(&cc,level,u.ux,u.uy,mons + 0x7f);
      if (bVar9 != '\0') {
        mk_roamer(mons + 0x7f,u.ualign.type,level,cc.x,cc.y,'\0');
      }
      iVar14 = iVar14 + -1;
    } while (1 < iVar14);
    goto LAB_00170c79;
  }
  if (u.ualign.record < 9) goto LAB_00170c79;
  pline("A voice whispers: \"Thou hast been worthy of me!\"");
  cc.x = u.ux;
  cc.y = u.uy;
  bVar9 = enexto(&cc,level,u.ux,u.uy,mons + 0x7f);
  if ((bVar9 == '\0') ||
     (pmVar17 = mk_roamer(mons + 0x7f,u.ualign.type,level,cc.x,cc.y,'\x01'), pmVar17 == (monst *)0x0
     )) goto LAB_00170c79;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00170ac6;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00170ac1;
LAB_00170b5b:
    pcVar22 = "An angel appears near you.";
  }
  else {
LAB_00170ac1:
    if (ublindf != (obj *)0x0) {
LAB_00170ac6:
      if (ublindf->oartifact == '\x1d') goto LAB_00170b5b;
    }
    pcVar22 = "You feel the presence of a friendly angel near you.";
  }
  pline(pcVar22);
  pmVar17->mtame = '\n';
  uVar21 = mt_random();
  bVar13 = ((byte)uVar21 & 7) + 0xf;
  pmVar17->m_lev = bVar13;
  uVar26 = (uint)bVar13;
  uVar21 = uVar26;
  do {
    uVar15 = mt_random();
    uVar26 = uVar26 + uVar15 % 10;
    uVar21 = uVar21 - 1;
  } while (uVar21 != 0);
  uVar21 = mt_random();
  iVar14 = uVar26 + uVar21 / 0x1e + uVar21 / 0x1e + (uVar21 / 0x1e) * -0x20 + uVar21 + 0x1f;
  pmVar17->mhpmax = iVar14;
  pmVar17->mhp = iVar14;
  poVar18 = select_hwep(pmVar17);
  if (poVar18 == (obj *)0x0) {
    poVar18 = mksobj(level,0x23,'\0','\0');
    iVar14 = mpickobj(pmVar17,poVar18);
    if (iVar14 != 0) {
      panic("merged weapon?");
    }
  }
  bless(poVar18);
  if (poVar18->spe < '\x04') {
    uVar21 = mt_random();
    poVar18->spe = ((byte)uVar21 & 3) + poVar18->spe + '\x01';
  }
  poVar18 = which_armor(pmVar17,8);
  if ((poVar18 == (obj *)0x0) || (poVar18->otyp != 0x8e)) {
    mongets(pmVar17,0xd0);
    m_dowear(level,pmVar17,'\x01');
  }
LAB_00170c79:
  assign_level(&u.uz0,&u.uz);
  if (level->levname[0] != '\0') {
    pline("You named this level: %s.",level);
  }
  in_out_region(level,u.ux,u.uy);
  pickup(1);
  return;
}

Assistant:

void goto_level(d_level *newlevel, boolean at_stairs, boolean falling, boolean portal)
{
	xchar new_ledger;
	boolean up = (depth(newlevel) < depth(&u.uz)),
		newdungeon = (u.uz.dnum != newlevel->dnum),
		was_in_W_tower = In_W_tower(level, u.ux, u.uy),
		familiar = FALSE;
	boolean new = FALSE;	/* made a new level? */
	struct monst *mtmp, *mtmp2;
	struct obj *otmp;
	struct level *origlev;

	if (dunlev(newlevel) > dunlevs_in_dungeon(newlevel))
		newlevel->dlevel = dunlevs_in_dungeon(newlevel);
	if (newdungeon && In_endgame(newlevel)) { /* 1st Endgame Level !!! */
		if (u.uhave.amulet) {
		    s_level *first_plane = get_first_elemental_plane();
		    pline("Well done, mortal!");
		    pline("But now thou must face the final Test...");
		    pline("Prove thyself worthy or perish!");
		    assign_level(newlevel, first_plane ? &first_plane->dlevel : NULL);
		} else
		    return;
	}
	new_ledger = ledger_no(newlevel);
	if (new_ledger <= 0)
		done(ESCAPED);	/* in fact < 0 is impossible */

	/* Prevent the player from going past the first quest level unless
	 * (s)he has been given the go-ahead by the leader.
	 */
	if (on_level(&u.uz, &qstart_level) && !newdungeon && !ok_to_quest()) {
		pline("A mysterious force prevents you from descending.");
		return;
	}

	if (on_level(newlevel, &u.uz)) return;		/* this can happen */

	if (falling) /* assuming this is only trap door or hole */
	    impact_drop(NULL, u.ux, u.uy, newlevel->dlevel);

	check_special_room(TRUE);		/* probably was a trap door */
	if (Punished) unplacebc();
	u.utrap = 0;				/* needed in level_tele */
	fill_pit(level, u.ux, u.uy);
	u.ustuck = 0;				/* idem */
	u.uwilldrown = 0;
	u.uinwater = 0;
	u.uundetected = 0;	/* not hidden, even if means are available */

	if (Is_blackmarket(newlevel))
	    keepdogs(2, "can't follow you into the Black Market.");
	else if (Is_blackmarket(&u.uz))
	    keepdogs(2, "can't follow you through the portal.");
	else
	    keepdogs(0, NULL);

	if (u.uswallow)				/* idem */
		u.uswldtim = u.uswallow = 0;
	/*
	 *  We no longer see anything on the level->  Make sure that this
	 *  follows u.uswallow set to null since uswallow overrides all
	 *  normal vision.
	 */
	vision_recalc(2);
	
	if (level->flags.purge_monsters) {
		/* purge any dead monsters */
		dmonsfree(level);
	}
	update_mlstmv();	/* current monsters are becoming inactive */
	

	assign_level(&u.uz0, &u.uz);
	assign_level(&u.uz, newlevel);
	assign_level(&u.utolev, newlevel);
	u.utotype = 0;

	/* If the entry level is the top level, then the dungeon goes down.
	 * Otherwise it goes up. */
	if (dungeons[u.uz.dnum].entry_lev == 1) {
	    if (dunlev_reached(&u.uz) < dunlev(&u.uz))
		dunlev_reached(&u.uz) = dunlev(&u.uz);
	} else {
	    if (dunlev_reached(&u.uz) > dunlev(&u.uz) || !dunlev_reached(&u.uz))
		dunlev_reached(&u.uz) = dunlev(&u.uz);
	}

	reset_rndmonst(NON_PM);   /* u.uz change affects monster generation */

	origlev = level;
	level = NULL;
	
	if (!levels[new_ledger]) {
		/* entering this level for first time; make it now */
		historic_event(FALSE, "reached %s.", hist_lev_name(&u.uz, FALSE));
		level = mklev(&u.uz);
		new = TRUE;	/* made the level */
	} else {
		/* returning to previously visited level */
		level = levels[new_ledger];

		/* regenerate animals while on another level */
		for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
			mtmp2 = mtmp->nmon;
			if (moves > level->lastmoves)
				mon_catchup_elapsed_time(mtmp, moves - level->lastmoves);

			/* update shape-changers in case protection against
			   them is different now */
			restore_cham(mtmp);
		}

		/* grow herbs and/or trees while on another level */
		catchup_dgn_growths(level, (moves - level->lastmoves) / 5);
	}

	/* some timers and lights might need to be transferred to the new level
	 * if they are attached to objects the hero is carrying */
	transfer_timers(origlev, level, 0);
	transfer_lights(origlev, level, 0);

	/* do this prior to level-change pline messages */
	vision_reset();		/* clear old level's line-of-sight */
	vision_full_recalc = 0;	/* don't let that reenable vision yet */
	flush_screen_disable();	/* ensure all map flushes are postponed */

	if (portal && !In_endgame(&u.uz)) {
	    /* find the portal on the new level */
	    struct trap *ttrap;

	    for (ttrap = level->lev_traps; ttrap; ttrap = ttrap->ntrap)
		if (ttrap->ttyp == MAGIC_PORTAL) break;

	    if (!ttrap) panic("goto_level: no corresponding portal!");
	    seetrap(ttrap);
	    u_on_newpos(ttrap->tx, ttrap->ty);
	} else if (at_stairs && !In_endgame(&u.uz)) {
	    if (up) {
		if (at_ladder) {
		    u_on_newpos(level->dnladder.sx, level->dnladder.sy);
		} else {
		    if (newdungeon) {
			if (Is_stronghold(&u.uz)) {
			    xchar x, y;
			    const dest_area *udst = &level->updest;
			    int trycnt = 0;

			    do {
				do {
				    x = rn1((udst->hx - udst->lx) + 1, udst->lx);
				    y = rn1((udst->hy - udst->ly) + 1, udst->ly);
				} while ((x < udst->nlx || x > udst->nhx) &&
					 (y < udst->nly || y > udst->nhy));
			    } while ((occupied(level, x, y) ||
				      IS_STWALL(level->locations[x][y].typ)) &&
				     trycnt++ < 1000);
			    if (trycnt >= 1000)
				warning("Castle: placement failed to find good pos");
			    u_on_newpos(x, y);
			} else u_on_sstairs();
		    } else u_on_dnstairs();
		}
		/* Remove bug which crashes with levitation/punishment  KAA */
		if (Punished && !Levitation) {
			pline("With great effort you climb the %s.",
				at_ladder ? "ladder" : "stairs");
		}
	    } else {	/* down */
		if (at_ladder) {
		    u_on_newpos(level->upladder.sx, level->upladder.sy);
		} else {
		    if (newdungeon) u_on_sstairs();
		    else u_on_upstairs();
		}
		if (at_stairs && Flying)
		    pline("You fly down along the %s.",
			at_ladder ? "ladder" : "stairs");
		else if (at_stairs &&
		    (near_capacity() > UNENCUMBERED ||
		     (Punished && (uwep != uball || P_SKILL(P_FLAIL) < P_BASIC ||
				   !Role_if(PM_CONVICT))) ||
		     Fumbling)) {
		    pline("You fall down the %s.", at_ladder ? "ladder" : "stairs");
		    if (Punished) {
			drag_down();
			if (carried(uball)) {
			    if (uwep == uball)
				setuwep(NULL);
			    if (uswapwep == uball)
				setuswapwep(NULL);
			    if (uquiver == uball)
				setuqwep(NULL);
			    freeinv(uball);
			}
		    }
		    /* falling off steed has its own losehp() call */
		    if (u.usteed)
			dismount_steed(DISMOUNT_FELL);
		    else
			losehp(rnd(3), "falling downstairs", KILLED_BY);
		    selftouch("Falling, you");
		}
	    }
	} else {	/* trap door or level_tele or In_endgame */
	    if (was_in_W_tower && On_W_tower_level(&u.uz))
		/* Stay inside the Wizard's tower when feasible.	*/
		/* Note: up vs down doesn't really matter in this case. */
		place_lregion(level, level->dndest.nlx, level->dndest.nly,
				level->dndest.nhx, level->dndest.nhy,
				0,0, 0,0, LR_DOWNTELE, NULL);
	    else if (up)
		place_lregion(level, level->updest.lx, level->updest.ly,
				level->updest.hx, level->updest.hy,
				level->updest.nlx, level->updest.nly,
				level->updest.nhx, level->updest.nhy,
				LR_UPTELE, NULL);
	    else
		place_lregion(level, level->dndest.lx, level->dndest.ly,
				level->dndest.hx, level->dndest.hy,
				level->dndest.nlx, level->dndest.nly,
				level->dndest.nhx, level->dndest.nhy,
				LR_DOWNTELE, NULL);
	    if (falling) {
		if (Punished) ballfall();
		selftouch("Falling, you");
	    }
	}

	if (Punished) placebc();

	/* only matters if falling;
	 * place objects that fell with the player nearby */
	while (level->objects[0][0]) {
	    deliver_object(level->objects[0][0], u.uz.dnum, u.uz.dlevel,
			   MIGR_NEAR_PLAYER);
	}

	for (otmp = invent; otmp; otmp = otmp->nobj)
	    set_obj_level(level, otmp);
	losedogs();
	kill_genocided_monsters();  /* for those wiped out while in limbo */
	/*
	 * Expire all timers that have gone off while away.  Must be
	 * after migrating monsters and objects are delivered
	 * (losedogs and obj_delivery).
	 */
	run_timers();

	initrack();

	if ((mtmp = m_at(level, u.ux, u.uy)) != 0
		&& mtmp != u.usteed) {
	    /* There's a monster at your target destination; it might be one
	       which accompanied you--see mon_arrive(dogmove.c)--or perhaps
	       it was already here.  Randomly move you to an adjacent spot
	       or else the monster to any nearby location.  Prior to 3.3.0
	       the latter was done unconditionally. */
	    coord cc;

	    if (!rn2(2) &&
		    enexto(&cc, level, u.ux, u.uy, youmonst.data) &&
		    distu(cc.x, cc.y) <= 2)
		u_on_newpos(cc.x, cc.y);	/*[maybe give message here?]*/
	    else
		mnexto(mtmp);

	    if ((mtmp = m_at(level, u.ux, u.uy)) != 0) {
		impossible("mnexto failed (do.c)?");
		rloc(level, mtmp, FALSE);
	    }
	}

	/* Stop autoexplore revisiting the entrance stairs. */
	level->locations[u.ux][u.uy].mem_stepped = 1;

	/* initial movement of bubbles just before vision_recalc */
	if (Is_waterlevel(&u.uz))
		movebubbles();

	if (level->flags.forgotten) {
	    familiar = TRUE;
	    level->flags.forgotten = FALSE;
	}
	
	notify_levelchange(NULL); /* inform window code of the level change */

	/* Reset the screen. */
	vision_reset();		/* reset the blockages */
	doredraw();		/* does a full vision recalc */
	flush_screen_enable();
	flush_screen();

	/*
	 *  Move all plines beyond the screen reset.
	 */

	/* give room entrance message, if any */
	check_special_room(FALSE);

	/* Check whether we just entered Gehennom. */
	if (!In_hell(&u.uz0) && Inhell) {
	    if (Is_valley(&u.uz)) {
		pline("You arrive at the Valley of the Dead...");
		pline("The odor of burnt flesh and decay pervades the air.");
		You_hear("groans and moans everywhere.");
	    } else pline("It is hot here.  You smell smoke...");
	}

	if (familiar) {
	    static const char * const fam_msgs[4] = {
		"You have a sense of deja vu.",
		"You feel like you've been here before.",
		"This place %s familiar...",
		0	/* no message */
	    };
	    static const char * const halu_fam_msgs[4] = {
		"Whoa!  Everything %s different.",
		"You are surrounded by twisty little passages, all alike.",
		"Gee, this %s like uncle Conan's place...",
		0	/* no message */
	    };
	    const char *mesg;
	    char buf[BUFSZ];
	    int which = rn2(4);

	    if (Hallucination)
		mesg = halu_fam_msgs[which];
	    else
		mesg = fam_msgs[which];
	    if (mesg && strchr(mesg, '%')) {
		sprintf(buf, mesg, !Blind ? "looks" : "seems");
		mesg = buf;
	    }
	    if (mesg) pline(mesg);
	}

	if (new && Is_rogue_level(&u.uz))
	    pline("You enter what seems to be an older, more primitive world.");

	if (new && Hallucination && Role_if(PM_ARCHEOLOGIST) &&
		Is_juiblex_level(&u.uz))
	    pline("Ahh, Venice.");

	/* Final confrontation */
	if (In_endgame(&u.uz) && newdungeon && u.uhave.amulet)
		resurrect();
	if (newdungeon && (In_V_tower(&u.uz) || In_dragon(&u.uz)) && In_hell(&u.uz0))
		pline("The heat and smoke are gone.");

	/* the message from your quest leader */
	if (!In_quest(&u.uz0) && at_dgn_entrance(&u.uz, "The Quest") &&
		!(u.uevent.qexpelled || u.uevent.qcompleted || quest_status.leader_is_dead)) {
		if (BTelepat) {
			if (uarmh)
			    pline("You sense something being blocked by %s.",
				  yname(uarmh));
		} else if (u.uevent.qcalled) {
			com_pager(Role_if (PM_ROGUE) ? 4 : 3);
		} else {
			com_pager(2);
			u.uevent.qcalled = TRUE;
		}
	}

	if (getmonth() == 12 && getmday() < 25) {
		if (mk_advcal_portal(level))
			pline("You smell chocolate!");
	}
	if (Is_advent_calendar(&u.uz))
		fill_advent_calendar(level, FALSE);

	/* once Croesus is dead, his alarm doesn't work any more */
	if (Is_knox(&u.uz) && (new || !mvitals[PM_CROESUS].died)) {
		pline("You penetrated a high security area!");
		pline("An alarm sounds!");
		for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
		    if (!DEADMONSTER(mtmp) && mtmp->msleeping) mtmp->msleeping = 0;
	}

	if (Is_blackmarket(&u.uz) && Conflict)
	    set_black_marketeer_angry();

	if (on_level(&u.uz, &astral_level))
	    final_level();
	else
	    onquest();
	assign_level(&u.uz0, &u.uz); /* reset u.uz0 */
	
	if (*level->levname)
	    pline("You named this level: %s.", level->levname);

	/* assume this will always return TRUE when changing level */
	in_out_region(level, u.ux, u.uy);
	pickup(1);
}